

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O2

int handlesbginterface(RS232PORT *pSBGInterfacePseudoRS232Port)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  ulong uVar6;
  int sendbuflen;
  float local_21e0;
  float local_21dc;
  float local_21d8;
  uint uStack_21d4;
  undefined4 uStack_21d0;
  undefined4 uStack_21cc;
  double local_21c8;
  double local_21c0;
  undefined1 local_21b8 [16];
  undefined1 local_21a8 [16];
  undefined1 local_2198 [16];
  undefined1 local_2188 [16];
  undefined4 local_2178;
  undefined4 uStack_2174;
  undefined4 uStack_2170;
  undefined4 uStack_216c;
  undefined4 local_2168;
  undefined4 uStack_2164;
  undefined4 uStack_2160;
  undefined4 uStack_215c;
  double qz;
  double qy;
  double qx;
  double qw;
  uchar local_2138 [4];
  undefined1 auStack_2134 [4];
  undefined4 uStack_2130;
  float fStack_212c;
  undefined2 uStack_2128;
  undefined1 uStack_2126;
  undefined1 uStack_2125;
  undefined2 uStack_2124;
  undefined2 uStack_2122;
  undefined4 local_2120;
  undefined2 uStack_211c;
  undefined2 uStack_211a;
  undefined4 uStack_2118;
  undefined2 uStack_2114;
  undefined4 uStack_2112;
  undefined2 uStack_210e;
  undefined2 uStack_210c;
  undefined2 uStack_210a;
  undefined2 uStack_2108;
  undefined8 uStack_2106;
  uint8 sendbuf [8192];
  
  qw = 0.0;
  qx = 0.0;
  qy = 0.0;
  qz = 0.0;
  sendbuflen = 0;
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  dVar1 = Center((interval *)&phihat);
  dVar1 = fmod_2PI(dVar1);
  local_21dc = (float)dVar1;
  dVar1 = Center((interval *)&thetahat);
  dVar1 = fmod_2PI(-dVar1);
  local_21e0 = (float)dVar1;
  uStack_21d4 = angle_env._4_4_ ^ 0x80000000;
  local_21d8 = (float)angle_env._0_4_;
  uStack_21d0 = 0;
  uStack_21cc = 0x80000000;
  dVar1 = Center((interval *)&psihat);
  dVar1 = fmod_2PI(((double)CONCAT44(uStack_21d4,local_21d8) - dVar1) + 1.5707963267948966);
  local_21d8 = (float)dVar1;
  euler2quaternion((double)local_21dc,(double)local_21e0,(double)local_21d8,&qw,&qx,&qy,&qz);
  uStack_2160 = SUB84(qx,0);
  uStack_215c = (undefined4)((ulong)qx >> 0x20);
  local_2168 = qw._0_4_;
  uStack_2164 = qw._4_4_;
  uStack_2170 = SUB84(qz,0);
  uStack_216c = (undefined4)((ulong)qz >> 0x20);
  local_2178 = qy._0_4_;
  uStack_2174 = qy._4_4_;
  local_21c0 = Center((interval *)&accrxhat);
  dVar1 = Center((interval *)&accryhat);
  local_2188._8_4_ = extraout_XMM0_Dc;
  local_2188._0_8_ = dVar1;
  local_2188._12_4_ = extraout_XMM0_Dd;
  dVar1 = Center((interval *)&accrzhat);
  local_2198._8_4_ = extraout_XMM0_Dc_00;
  local_2198._0_8_ = dVar1;
  local_2198._12_4_ = extraout_XMM0_Dd_00;
  local_21c8 = Center((interval *)&omegaxhat);
  dVar1 = Center((interval *)&omegayhat);
  local_21a8._8_4_ = extraout_XMM0_Dc_01;
  local_21a8._0_8_ = dVar1;
  local_21a8._12_4_ = extraout_XMM0_Dd_01;
  dVar1 = Center((interval *)&omegazhat);
  local_21b8._8_4_ = extraout_XMM0_Dc_02;
  local_21b8._0_8_ = dVar1;
  local_21b8._12_4_ = extraout_XMM0_Dd_02;
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  memset(&uStack_2125,0,0xed);
  builtin_memcpy(local_2138,"ELLI",4);
  auStack_2134._0_2_ = 0x5350;
  auStack_2134._2_2_ = 0x3245;
  uStack_2130._0_2_ = 0x412d;
  uStack_2130._2_2_ = 0x472d;
  fStack_212c = 1.018945e-11;
  uStack_2128 = 0x3142;
  uStack_2126 = 0;
  uStack_2118 = 45000000;
  uStack_2112 = 0x7e30101;
  uStack_210e = 0x1604;
  uStack_210a = 0x101;
  uStack_2106 = CONCAT62(uStack_2106._2_6_,0x106);
  EncodeFrameSBG(sendbuf,&sendbuflen,'\x04','\x10',local_2138,0x3a);
  iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
  iVar4 = 1;
  if (iVar3 == 0) {
    local_2138[0] = '\x03';
    local_2138[2] = 0x10;
    auStack_2134._0_2_ = 0;
    EncodeFrameSBG(sendbuf,&sendbuflen,'\0','\x10',local_2138,6);
    iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
    if (iVar3 == 0) {
      local_2138[0] = '\0';
      local_2138[1] = 0;
      local_2138[2] = 0;
      local_2138[3] = 0;
      auStack_2134._0_2_ = 0;
      EncodeFrameSBG(sendbuf,&sendbuflen,'\x03','\x10',local_2138,6);
      iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
      if (iVar3 == 0) {
        local_2138[0] = '\x03';
        local_2138[2] = 0x10;
        auStack_2134._0_2_ = 0;
        EncodeFrameSBG(sendbuf,&sendbuflen,'\0','\x10',local_2138,6);
        iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
        if (iVar3 == 0) {
          local_2138[0] = '\x01';
          local_2138[1] = 0;
          local_2138[2] = 0;
          local_2138[3] = 0;
          auStack_2134._0_2_ = 0;
          EncodeFrameSBG(sendbuf,&sendbuflen,'\x03','\x10',local_2138,6);
          iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
          if (iVar3 == 0) {
            local_2138[0] = '\x03';
            local_2138[2] = 0x10;
            auStack_2134._0_2_ = 0;
            EncodeFrameSBG(sendbuf,&sendbuflen,'\0','\x10',local_2138,6);
            iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
            if (iVar3 == 0) {
              local_2138[0] = '\x02';
              local_2138[1] = 0;
              EncodeFrameSBG(sendbuf,&sendbuflen,'\x03','\x10',local_2138,2);
              iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
              if (iVar3 == 0) {
                local_2138[0] = '\x03';
                local_2138[2] = 0x10;
                auStack_2134._0_2_ = 0;
                EncodeFrameSBG(sendbuf,&sendbuflen,'\0','\x10',local_2138,6);
                iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
                if (iVar3 == 0) {
                  local_2138[0] = '\0';
                  local_2138[1] = 0;
                  local_2138[2] = 0;
                  local_2138[3] = 0;
                  auStack_2134._0_2_ = SUB42(local_21dc,0);
                  auStack_2134._2_2_ = (undefined2)((uint)local_21dc >> 0x10);
                  uStack_2130._0_2_ = SUB42(local_21e0,0);
                  uStack_2130._2_2_ = (undefined2)((uint)local_21e0 >> 0x10);
                  fStack_212c = local_21d8;
                  uStack_2128 = 0;
                  uStack_2126 = 0;
                  uStack_2125 = 0;
                  uStack_2124 = 0;
                  uStack_2122 = 0;
                  local_2120 = 0;
                  uStack_211c = 2;
                  uStack_211a = 0;
                  EncodeFrameSBG(sendbuf,&sendbuflen,'\x06','\0',local_2138,0x20);
                  iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
                  if (iVar3 == 0) {
                    fStack_212c = (float)(double)CONCAT44(uStack_2174,local_2178);
                    fVar5 = (float)(double)CONCAT44(uStack_216c,uStack_2170);
                    auStack_2134 = (undefined1  [4])(float)(double)CONCAT44(uStack_2164,local_2168);
                    uStack_2130 = (float)(double)CONCAT44(uStack_215c,uStack_2160);
                    local_2138[0] = '\0';
                    local_2138[1] = 0;
                    local_2138[2] = 0;
                    local_2138[3] = 0;
                    uStack_2128 = SUB42(fVar5,0);
                    uStack_2126 = (undefined1)((uint)fVar5 >> 0x10);
                    uStack_2125 = (undefined1)((uint)fVar5 >> 0x18);
                    uStack_2124 = 0;
                    uStack_2122 = 0;
                    local_2120 = 0;
                    uStack_211c = 0;
                    uStack_211a = 0;
                    uStack_2118 = 2;
                    EncodeFrameSBG(sendbuf,&sendbuflen,'\a','\0',local_2138,0x24);
                    iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
                    if (iVar3 == 0) {
                      register0x00001200 = (float)local_21c0;
                      fVar5 = (float)local_21c8;
                      local_2138[0] = '\0';
                      local_2138[1] = 0;
                      local_2138[2] = 0;
                      local_2138[3] = 0;
                      uVar2 = CONCAT44((float)(double)local_2198._0_8_,
                                       (float)(double)local_2188._0_8_) ^ 0x8000000080000000;
                      auStack_2134._0_2_ = 0xffff;
                      uVar6 = CONCAT44((float)(double)local_21b8._0_8_,
                                       (float)(double)local_21a8._0_8_) ^ 0x8000000080000000;
                      uStack_2130._2_2_ = SUB42((float)(double)local_2188._0_8_,0);
                      fStack_212c = (float)(uVar2 >> 0x10);
                      uStack_2128 = (undefined2)(uVar2 >> 0x30);
                      uStack_2126 = SUB41(fVar5,0);
                      uStack_2125 = (undefined1)((uint)fVar5 >> 8);
                      uStack_2124 = (undefined2)((uint)fVar5 >> 0x10);
                      uStack_2122 = SUB42((float)(double)local_21a8._0_8_,0);
                      local_2120 = (undefined4)(uVar6 >> 0x10);
                      uStack_211c = (undefined2)(uVar6 >> 0x30);
                      uStack_211a = 0;
                      uStack_2118 = 0;
                      uStack_2114 = 0;
                      uStack_2112 = 0;
                      uStack_210e = 0;
                      uStack_210c = 0;
                      uStack_210a = 0;
                      uStack_2108 = 0;
                      uStack_2106 = 0;
                      EncodeFrameSBG(sendbuf,&sendbuflen,'\x03','\0',local_2138,0x3a);
                      iVar3 = WriteAllRS232Port(pSBGInterfacePseudoRS232Port,sendbuf,sendbuflen);
                      if (iVar3 == 0) {
                        uSleep(20000);
                        iVar4 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int handlesbginterface(RS232PORT* pSBGInterfacePseudoRS232Port)
{
	uInt_SBG serial, hwRev, fwRev, calRev;
	uShort_SBG calYear;
	unsigned char calMonth = 0, calDay = 0;
	uShort_SBG transferCmd;
	uInt_SBG transferSize, transferOffset;
	unsigned char cmdId = 0, classId = 0;
	uShort_SBG errorCode;
	uInt_SBG time_stamp, solution_status;
	uShort_SBG imu_status;
	uFloat_SBG roll, pitch, yaw;
	uFloat_SBG q0, q1, q2, q3;
	double qw = 0, qx = 0, qy = 0, qz = 0;
	uFloat_SBG roll_acc, pitch_acc, yaw_acc;
	uFloat_SBG accx, accy, accz, gyrx, gyry, gyrz, temp, delta_vel_x, delta_vel_y, delta_vel_z, delta_angle_x, delta_angle_y, delta_angle_z;
	int sendbuflen = 0;
	uint8 sendbuf[MAX_NB_BYTES_SBG];
	unsigned char payload[256];
	int len = 0;
	int offset = 0;

	EnterCriticalSection(&StateVariablesCS);

	time_stamp.v = 0;
	roll.v = (float)fmod_2PI(Center(phihat));
	pitch.v = (float)fmod_2PI(-Center(thetahat));
	yaw.v = (float)fmod_2PI(-angle_env-Center(psihat)+M_PI/2.0);
	euler2quaternion((double)roll.v, (double)pitch.v, (double)yaw.v, &qw, &qx, &qy, &qz);
	q0.v = (float)qw; q1.v = (float)qx; q2.v = (float)qy; q3.v = (float)qz;
	roll_acc.v = 0;
	pitch_acc.v = 0;
	yaw_acc.v = 0;
	solution_status.v = SBG_ECOM_SOL_MODE_AHRS;

	imu_status.v = (unsigned short)0xFFFF;
	accx.v = (float)Center(accrxhat);
	accy.v = (float)-Center(accryhat);
	accz.v = (float)-Center(accrzhat);
	gyrx.v = (float)Center(omegaxhat);
	gyry.v = (float)-Center(omegayhat);
	gyrz.v = (float)-Center(omegazhat);
	temp.v = 0;
	delta_vel_x.v = 0;
	delta_vel_y.v = 0;
	delta_vel_z.v = 0;
	delta_angle_x.v = 0;
	delta_angle_y.v = 0;
	delta_angle_z.v = 0;

	LeaveCriticalSection(&StateVariablesCS);

	serial.v = 45000000;
	calYear.v = 2019; calMonth = 4, calDay = 22;
	calRev.c[3] = 1; calRev.c[2] = 1;
	hwRev.c[3] = 1; hwRev.c[2] = 1;
	fwRev.c[3] = 1; fwRev.c[2] = 6;

	memset(payload, 0, sizeof(payload));
	strcpy((char*)payload, "ELLIPSE2-A-G4A3-B1");
	offset = 32;
	memcpy(payload+offset, serial.c, 4);
	offset += 4;
	memcpy(payload+offset, calRev.c, 4);
	offset += 4;
	memcpy(payload+offset, calYear.c, 2);
	offset += 2;
	memcpy(payload+offset, &calMonth, 1);
	offset += 1;
	memcpy(payload+offset, &calDay, 1);
	offset += 1;
	memcpy(payload+offset, hwRev.c, 4);
	offset += 4;
	memcpy(payload+offset, fwRev.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 58;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_INFO, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0000;
	transferSize.v = 0;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	memcpy(payload+offset, transferSize.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0001;
	transferOffset.v = 0;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	memcpy(payload+offset, transferOffset.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0002;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, roll.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw.c, 4);
	offset += 4;
	memcpy(payload+offset, roll_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, solution_status.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 32;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_EKF_EULER, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, q0.c, 4);
	offset += 4;
	memcpy(payload+offset, q1.c, 4);
	offset += 4;
	memcpy(payload+offset, q2.c, 4);
	offset += 4;
	memcpy(payload+offset, q3.c, 4);
	offset += 4;
	memcpy(payload+offset, roll_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, solution_status.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 36;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_EKF_QUAT, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, imu_status.c, 2);
	offset += 2;
	memcpy(payload+offset, accx.c, 4);
	offset += 4;
	memcpy(payload+offset, accy.c, 4);
	offset += 4;
	memcpy(payload+offset, accz.c, 4);
	offset += 4;
	memcpy(payload+offset, gyrx.c, 4);
	offset += 4;
	memcpy(payload+offset, gyry.c, 4);
	offset += 4;
	memcpy(payload+offset, gyrz.c, 4);
	offset += 4;
	memcpy(payload+offset, temp.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_x.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_y.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_z.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_x.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_y.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_z.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 58;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_IMU_DATA, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	uSleep(1000*20);

	return EXIT_SUCCESS;
}